

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::IntersectFrames<duckdb::QuantileReuseUpdater>
               (SubFrames *lefts,SubFrames *rights,QuantileReuseUpdater *op)

{
  idx_t *piVar1;
  idx_t iVar2;
  const_reference pvVar3;
  ulong uVar4;
  const_reference pvVar5;
  byte bVar6;
  ulong uVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  ulong uVar10;
  ulong __n;
  ulong uVar11;
  byte bVar12;
  FrameBounds last;
  value_type local_40;
  
  pvVar3 = vector<duckdb::FrameBounds,_true>::operator[](rights,0);
  uVar10 = pvVar3->start;
  pvVar3 = vector<duckdb::FrameBounds,_true>::operator[](lefts,0);
  uVar11 = pvVar3->start;
  if (uVar10 < pvVar3->start) {
    uVar11 = uVar10;
  }
  pvVar3 = vector<duckdb::FrameBounds,_true>::back(rights);
  uVar10 = pvVar3->end;
  pvVar3 = vector<duckdb::FrameBounds,_true>::back(lefts);
  uVar4 = pvVar3->end;
  if (pvVar3->end < uVar10) {
    uVar4 = uVar10;
  }
  local_40.start = uVar4;
  local_40.end = uVar4;
  if (uVar11 < uVar4) {
    uVar10 = 0;
    __n = 0;
    do {
      if (__n < (ulong)((long)(lefts->
                              super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                              ).
                              super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(lefts->
                              super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                              ).
                              super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        pvVar3 = vector<duckdb::FrameBounds,_true>::operator[](lefts,__n);
        bVar12 = uVar11 < pvVar3->end && pvVar3->start <= uVar11;
      }
      else {
        bVar12 = false;
        pvVar3 = &local_40;
      }
      if (uVar10 < (ulong)((long)(rights->
                                 super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                 ).
                                 super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(rights->
                                 super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                 ).
                                 super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        pvVar5 = vector<duckdb::FrameBounds,_true>::operator[](rights,uVar10);
        bVar6 = (uVar11 < pvVar5->end) * '\x02';
        if (uVar11 < pvVar5->start) {
          bVar6 = 0;
        }
        bVar12 = bVar6 | bVar12;
      }
      else {
        pvVar5 = &local_40;
      }
      pvVar8 = pvVar3;
      pvVar9 = pvVar5;
      if (bVar12 == 0) {
LAB_00e02889:
        uVar7 = pvVar8->start;
        if (pvVar9->start < pvVar8->start) {
          uVar7 = pvVar9->start;
        }
      }
      else {
        if (bVar12 != 2) {
          if (bVar12 == 1) {
            pvVar9 = (const_reference)&pvVar3->end;
            pvVar8 = pvVar5;
          }
          else {
            pvVar9 = (const_reference)&pvVar5->end;
            pvVar8 = (const_reference)&pvVar3->end;
          }
          goto LAB_00e02889;
        }
        uVar7 = pvVar3->start;
        if (pvVar5->end < pvVar3->start) {
          uVar7 = pvVar5->end;
        }
        if (uVar11 < uVar7) {
          piVar1 = op->index;
          do {
            iVar2 = op->j;
            op->j = iVar2 + 1;
            piVar1[iVar2] = uVar11;
            uVar11 = uVar11 + 1;
          } while (uVar7 != uVar11);
        }
      }
      __n = __n + (uVar7 == pvVar3->end);
      uVar10 = uVar10 + (uVar7 == pvVar5->end);
      uVar11 = uVar7;
    } while (uVar7 < uVar4);
  }
  return;
}

Assistant:

static void IntersectFrames(const SubFrames &lefts, const SubFrames &rights, OP &op) {
		const auto cover_start = MinValue(rights[0].start, lefts[0].start);
		const auto cover_end = MaxValue(rights.back().end, lefts.back().end);
		const FrameBounds last(cover_end, cover_end);

		//	Subframe indices
		idx_t l = 0;
		idx_t r = 0;
		for (auto i = cover_start; i < cover_end;) {
			uint8_t overlap = 0;

			// Are we in the previous frame?
			auto left = &last;
			if (l < lefts.size()) {
				left = &lefts[l];
				overlap |= uint8_t(left->start <= i && i < left->end) << 0;
			}

			// Are we in the current frame?
			auto right = &last;
			if (r < rights.size()) {
				right = &rights[r];
				overlap |= uint8_t(right->start <= i && i < right->end) << 1;
			}

			auto limit = i;
			switch (overlap) {
			case 0x00:
				// i ∉ F U P
				limit = MinValue(right->start, left->start);
				op.Neither(i, limit);
				break;
			case 0x01:
				// i ∈ P \ F
				limit = MinValue(left->end, right->start);
				op.Left(i, limit);
				break;
			case 0x02:
				// i ∈ F \ P
				limit = MinValue(right->end, left->start);
				op.Right(i, limit);
				break;
			case 0x03:
			default:
				D_ASSERT(overlap == 0x03);
				// i ∈ F ∩ P
				limit = MinValue(right->end, left->end);
				op.Both(i, limit);
				break;
			}

			// Advance  the subframe indices
			i = limit;
			l += (i == left->end);
			r += (i == right->end);
		}
	}